

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

bool ggml_graph_compute_helper(ggml_backend_sched_t sched,ggml_cgraph *graph,int n_threads)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  code *pcVar5;
  int i;
  int iVar6;
  
  iVar6 = 0;
  while( true ) {
    iVar1 = ggml_backend_sched_get_n_backends(sched);
    if (iVar1 <= iVar6) break;
    uVar2 = ggml_backend_sched_get_backend(sched,iVar6);
    lVar3 = ggml_backend_get_device(uVar2);
    if (lVar3 == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = ggml_backend_dev_backend_reg(lVar3);
    }
    pcVar5 = (code *)ggml_backend_reg_get_proc_address(uVar4,"ggml_backend_set_n_threads");
    if (pcVar5 != (code *)0x0) {
      (*pcVar5)(uVar2,n_threads);
    }
    iVar6 = iVar6 + 1;
  }
  iVar6 = ggml_backend_sched_graph_compute(sched,graph);
  ggml_backend_sched_reset(sched);
  return iVar6 == 0;
}

Assistant:

static bool ggml_graph_compute_helper(
      ggml_backend_sched_t   sched,
        struct ggml_cgraph * graph,
                       int   n_threads) {

    for (int i = 0; i < ggml_backend_sched_get_n_backends(sched); ++i) {
        ggml_backend_t backend = ggml_backend_sched_get_backend(sched, i);
        ggml_backend_dev_t dev = ggml_backend_get_device(backend);
        ggml_backend_reg_t reg = dev ? ggml_backend_dev_backend_reg(dev) : nullptr;

        auto * fn_set_n_threads = (ggml_backend_set_n_threads_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_n_threads");
        if (fn_set_n_threads) {
            fn_set_n_threads(backend, n_threads);
        }
    }

    bool t = ggml_backend_sched_graph_compute(sched, graph) == GGML_STATUS_SUCCESS;
    ggml_backend_sched_reset(sched);
    return t;
}